

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSelector.cpp
# Opt level: O2

void __thiscall cali::RecordSelector::RecordSelector(RecordSelector *this,QuerySpec *spec)

{
  RecordSelectorImpl *__p;
  
  __p = (RecordSelectorImpl *)operator_new(0x18);
  (__p->m_filters).
  super__Vector_base<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_filters).
  super__Vector_base<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->m_filters).
  super__Vector_base<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<cali::RecordSelector::RecordSelectorImpl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cali::RecordSelector::RecordSelectorImpl,void>
            ((__shared_ptr<cali::RecordSelector::RecordSelectorImpl,(__gnu_cxx::_Lock_policy)2> *)
             this,__p);
  RecordSelectorImpl::configure
            ((this->mP).
             super___shared_ptr<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,spec);
  return;
}

Assistant:

RecordSelector::RecordSelector(const QuerySpec& spec) : mP { new RecordSelectorImpl }
{
    mP->configure(spec);
}